

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idyntree-model-info.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ostream *poVar5;
  int iVar6;
  KinDynComputations model;
  ModelLoader loader;
  string modelPath;
  parser cmd;
  string local_140;
  ModelLoader local_120 [8];
  long *local_118;
  long local_110;
  long local_108 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  parser local_d8;
  
  local_d8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8.options._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8.ftr._M_dataplus._M_p = (pointer)&local_d8.ftr.field_2;
  local_d8.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8.ordered.
  super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.ordered.
  super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.ordered.
  super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.ftr._M_string_length = 0;
  local_d8.ftr.field_2._M_local_buf[0] = '\0';
  local_d8.prog_name._M_dataplus._M_p = (pointer)&local_d8.prog_name.field_2;
  local_d8.prog_name._M_string_length = 0;
  local_d8.prog_name.field_2._M_local_buf[0] = '\0';
  local_d8.others.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.others.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.others.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  addOptions(&local_d8);
  cmdline::parser::parse_check(&local_d8,argc,argv);
  paVar1 = &local_140.field_2;
  local_140._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"model","");
  pbVar4 = cmdline::parser::get<std::__cxx11::string>(&local_d8,&local_140);
  pcVar2 = (pbVar4->_M_dataplus)._M_p;
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar2,pcVar2 + pbVar4->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  iDynTree::ModelLoader::ModelLoader(local_120);
  local_140._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"urdf","");
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar3 = iDynTree::ModelLoader::loadModelFromFile
                    ((string *)local_120,(string *)&local_118,(vector *)&local_140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  iDynTree::KinDynComputations::KinDynComputations((KinDynComputations *)&local_140);
  if (cVar3 != '\0') {
    iDynTree::ModelLoader::model();
    cVar3 = iDynTree::KinDynComputations::loadRobotModel((Model *)&local_140);
    if (cVar3 != '\0') {
      handlePrintOption((KinDynComputations *)&local_140,&local_d8);
      handleTotalMassOptions((KinDynComputations *)&local_140,&local_d8);
      handleLinkCOMOptions((KinDynComputations *)&local_140,&local_d8);
      iVar6 = 0;
      handleFramePoseOptions((KinDynComputations *)&local_140,&local_d8);
      goto LAB_0010594a;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Impossible to read model at file ",0x21);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_118,local_110);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  iVar6 = 1;
  std::ostream::flush();
LAB_0010594a:
  iDynTree::KinDynComputations::~KinDynComputations((KinDynComputations *)&local_140);
  iDynTree::ModelLoader::~ModelLoader(local_120);
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0] + 1);
  }
  cmdline::parser::~parser(&local_d8);
  return iVar6;
}

Assistant:

int main(int argc, char** argv)
{
    cmdline::parser cmd;
    addOptions(cmd);
    cmd.parse_check(argc, argv);

    // Read model
    std::string modelPath = cmd.get<std::string>("model");
    iDynTree::ModelLoader loader;
    bool ok = loader.loadModelFromFile(modelPath);
    iDynTree::KinDynComputations model;
    if( !ok || !model.loadRobotModel(loader.model()))
    {
        std::cerr << "Impossible to read model at file " << modelPath << std::endl;
        return EXIT_FAILURE;
    }

    // Handle print option
    handlePrintOption(model,cmd);

    // Handle total mass option
    handleTotalMassOptions(model,cmd);

    // Handle link com
    handleLinkCOMOptions(model,cmd);

    // Handle frame pose
    handleFramePoseOptions(model,cmd);


    return EXIT_SUCCESS;
}